

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

void __thiscall
absl::status_internal::StatusRep::SetPayload(StatusRep *this,string_view type_url,Cord *payload)

{
  unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
  *this_01;
  CordRep *pCVar2;
  pointer __p;
  pointer __p_00;
  reference pVVar3;
  Cord *pCVar4;
  optional<unsigned_long> oVar5;
  string_view type_url_00;
  Payload local_60;
  
  type_url_00._M_len = type_url._M_str;
  this_00 = &this->payloads_;
  pCVar4 = payload;
  if ((this->payloads_)._M_t.
      super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
      .
      super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
      ._M_head_impl ==
      (InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
       *)0x0) {
    __p_00 = (pointer)operator_new(0x38);
    pCVar4 = (Cord *)0x0;
    (__p_00->storage_).metadata_.
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value = 0;
    local_60.type_url._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
    ::reset((__uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             *)this_00,__p_00);
    std::
    unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
    ::~unique_ptr((unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                   *)&local_60);
  }
  type_url_00._M_str = (char *)pCVar4;
  oVar5 = FindPayloadIndexByUrl
                    ((status_internal *)
                     (this_00->_M_t).
                     super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                     .
                     super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
                     ._M_head_impl,(Payloads *)type_url._M_len,type_url_00);
  if (((undefined1  [16])
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    this_01 = &((this_00->_M_t).
                super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                .
                super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
               ._M_head_impl)->storage_;
    paVar1 = &local_60.type_url.field_2;
    local_60.type_url._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,type_url_00._M_len,
               type_url_00._M_len + (long)&((Payloads *)type_url._M_len)->storage_);
    local_60.payload.contents_.data_.rep_.field_0.as_tree.cordz_info =
         (payload->contents_).data_.rep_.field_0.as_tree.cordz_info;
    local_60.payload.contents_.data_.rep_.field_0.as_tree.rep =
         (payload->contents_).data_.rep_.field_0.as_tree.rep;
    (payload->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (payload->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    inlined_vector_internal::
    Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>::
    EmplaceBack<absl::status_internal::Payload>(this_01,&local_60);
    Cord::~Cord(&local_60.payload);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.type_url._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.type_url._M_dataplus._M_p,
                      local_60.type_url.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pVVar3 = InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
             ::operator[]((this_00->_M_t).
                          super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                          .
                          super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
                          ._M_head_impl,
                          oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_payload);
    if (((pVVar3->payload).contents_.data_.rep_.field_0.data[0] & 1U) != 0) {
      Cord::InlineRep::UnrefTree(&(pVVar3->payload).contents_);
    }
    pCVar2 = (payload->contents_).data_.rep_.field_0.as_tree.rep;
    (pVVar3->payload).contents_.data_.rep_.field_0.as_tree.cordz_info =
         (payload->contents_).data_.rep_.field_0.as_tree.cordz_info;
    (pVVar3->payload).contents_.data_.rep_.field_0.as_tree.rep = pCVar2;
    (payload->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (payload->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  }
  return;
}

Assistant:

void StatusRep::SetPayload(absl::string_view type_url, absl::Cord payload) {
  if (payloads_ == nullptr) {
    payloads_ = absl::make_unique<status_internal::Payloads>();
  }

  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (index.has_value()) {
    (*payloads_)[index.value()].payload = std::move(payload);
    return;
  }

  payloads_->push_back({std::string(type_url), std::move(payload)});
}